

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O1

log_record log_handle_push(log_handle handle,log_record_ctor record_ctor)

{
  size_t *psVar1;
  log_record __src;
  size_t __size;
  log_record plVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (handle->count + 1 == handle->size) {
    __size = handle->size * 2;
    plVar2 = (log_record)realloc(handle->buffer,__size);
    if (plVar2 == (log_record)0x0) {
      return (log_record)0x0;
    }
    handle->buffer = plVar2;
    handle->size = __size;
  }
  if (handle->count != 0) {
    plVar2 = handle->buffer;
    sVar3 = log_record_size();
    __src = handle->buffer;
    sVar4 = log_record_size();
    memmove((void *)((long)&plVar2->time + sVar3),__src,sVar4 * handle->count);
  }
  psVar1 = &handle->count;
  *psVar1 = *psVar1 + 1;
  if (*psVar1 == 0) {
    return (log_record)0x0;
  }
  plVar2 = handle->buffer;
  log_record_size();
  plVar2 = log_record_initialize(plVar2,record_ctor);
  return plVar2;
}

Assistant:

log_record log_handle_push(log_handle handle, const log_record_ctor record_ctor)
{
	if ((handle->count + 1) == handle->size)
	{
		const size_t new_size = handle->size << 0x01;

		register void *buffer = realloc(handle->buffer, new_size);

		if (buffer == NULL)
		{
			return NULL;
		}

		handle->buffer = buffer;

		handle->size = new_size;
	}

	if (handle->count > 0)
	{
		void *dest = (unsigned char *)(handle->buffer) + log_record_size();

		memmove(dest, handle->buffer, log_record_size() * handle->count);
	}

	++handle->count;

	return log_handle_set(handle, 0, record_ctor);
}